

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

UInt32 crnlib::Bt3Zip_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit_00;
  Byte *pBVar1;
  uint uVar2;
  UInt32 UVar3;
  UInt32 *pUVar4;
  UInt32 curMatch;
  Byte *cur;
  UInt32 hashValue;
  UInt32 lenLimit;
  UInt32 offset;
  UInt32 *distances_local;
  CMatchFinder *p_local;
  
  lenLimit_00 = p->lenLimit;
  if (lenLimit_00 < 3) {
    MatchFinder_MovePos(p);
    p_local._4_4_ = 0;
  }
  else {
    pBVar1 = p->buffer;
    uVar2 = ((uint)CONCAT11(*pBVar1,pBVar1[2]) ^ p->crc[pBVar1[1]]) & 0xffff;
    UVar3 = p->hash[uVar2];
    p->hash[uVar2] = p->pos;
    pUVar4 = GetMatchesSpec1(lenLimit_00,UVar3,p->pos,p->buffer,p->son,p->cyclicBufferPos,
                             p->cyclicBufferSize,p->cutValue,distances,2);
    p_local._4_4_ = (UInt32)((long)pUVar4 - (long)distances >> 2);
    p->cyclicBufferPos = p->cyclicBufferPos + 1;
    p->buffer = p->buffer + 1;
    UVar3 = p->pos + 1;
    p->pos = UVar3;
    if (UVar3 == p->posLimit) {
      MatchFinder_CheckLimits(p);
    }
  }
  return p_local._4_4_;
}

Assistant:

UInt32 Bt3Zip_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 offset;
  GET_MATCHES_HEADER(3)
  HASH_ZIP_CALC;
  curMatch = p->hash[hashValue];
  p->hash[hashValue] = p->pos;
  offset = 0;
  GET_MATCHES_FOOTER(offset, 2)
}